

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scsp.c
# Opt level: O0

UINT8 device_start_scsp(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  scsp_state *scsp_00;
  scsp_state *scsp;
  DEV_INFO *retDevInf_local;
  DEV_GEN_CFG *cfg_local;
  
  scsp_00 = (scsp_state *)calloc(1,0x82e58);
  if (scsp_00 == (scsp_state *)0x0) {
    cfg_local._7_1_ = 0xff;
  }
  else {
    SCSP_Init(scsp_00,cfg->clock);
    scsp_set_mute_mask(scsp_00,0);
    scsp_00->_devData = (DEV_DATA)scsp_00;
    INIT_DEVINF(retDevInf,(DEV_DATA *)scsp_00,scsp_00->rate,&devDef);
    cfg_local._7_1_ = '\0';
  }
  return cfg_local._7_1_;
}

Assistant:

static UINT8 device_start_scsp(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	scsp_state *scsp;

	scsp = (scsp_state *)calloc(1, sizeof(scsp_state));
	if (scsp == NULL)
		return 0xFF;

	// init the emulation
	SCSP_Init(scsp, cfg->clock);

	scsp_set_mute_mask(scsp, 0x00000000);

	scsp->_devData.chipInf = scsp;
	INIT_DEVINF(retDevInf, &scsp->_devData, scsp->rate, &devDef);

	return 0x00;
}